

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall DPolyAction::StopInterpolation(DPolyAction *this)

{
  DInterpolation *this_00;
  
  this_00 = (this->m_Interpolation).field_0.p;
  if (this_00 != (DInterpolation *)0x0) {
    if (((this_00->super_DObject).ObjectFlags & 0x20) == 0) {
      DInterpolation::DelRef(this_00,false);
    }
    (this->m_Interpolation).field_0.p = (DInterpolation *)0x0;
  }
  return;
}

Assistant:

void DPolyAction::StopInterpolation ()
{
	if (m_Interpolation != NULL)
	{
		m_Interpolation->DelRef();
		m_Interpolation = NULL;
	}
}